

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,string *stampDir)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  string line;
  string mod;
  string local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  bVar3 = false;
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream(fin,&line,(bool *)0x0,-1);
    if (!bVar2) break;
    if (line._M_string_length != 0) {
      cVar1 = *line._M_dataplus._M_p;
      if ((cVar1 != '\r') && (cVar1 != '#')) {
        if (cVar1 == ' ') {
          bVar2 = bVar3 != false;
          bVar3 = false;
          if (bVar2) {
            std::__cxx11::string::string((string *)&mod,(string *)&line);
            bVar3 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(&mod,(char (*) [5])".mod");
            if (!bVar3) {
              bVar3 = cmHasLiteralSuffix<std::__cxx11::string,6ul>(&mod,(char (*) [6])".smod");
              if (!bVar3) {
                std::__cxx11::string::append((char *)&mod);
              }
            }
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&mod);
            ConsiderModule(this,&local_50,stampDir);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&mod);
            bVar3 = true;
          }
        }
        else {
          bVar3 = std::operator==(&line,"provides");
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const std::string& stampDir)
{
  std::string line;
  bool doing_provides = false;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Ignore comments and empty lines.
    if (line.empty() || line[0] == '#' || line[0] == '\r') {
      continue;
    }

    if (line[0] == ' ') {
      if (doing_provides) {
        std::string mod = line;
        if (!cmHasLiteralSuffix(mod, ".mod") &&
            !cmHasLiteralSuffix(mod, ".smod")) {
          // Support fortran.internal files left by older versions of CMake.
          // They do not include the ".mod" extension.
          mod += ".mod";
        }
        this->ConsiderModule(mod.substr(1), stampDir);
      }
    } else if (line == "provides") {
      doing_provides = true;
    } else {
      doing_provides = false;
    }
  }
}